

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Read_From_File_And_Create_Bill
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,fstream *inFile
          )

{
  long lVar1;
  istream *piVar2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  ostream *poVar3;
  int iVar4;
  long local_218;
  string word;
  string items;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  istringstream ss;
  
  lVar1 = *(long *)(*(long *)inFile + -0x18);
  if (((byte)inFile[lVar1 + 0x20] & 5) == 0) {
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items._M_dataplus._M_p = (pointer)&items.field_2;
    items._M_string_length = 0;
    items.field_2._M_local_buf[0] = '\0';
    local_218 = 0;
    iVar4 = 0;
    while (((byte)inFile[lVar1 + 0x20] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)inFile,(string *)&items);
      std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&items,_S_in);
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar2 = std::operator>>((istream *)&ss,(string *)&word);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&temp,&word);
        if (iVar4 == 4) {
          this_00 = Patient::Bill_Info_getter_abi_cxx11_
                              ((All_Of_Patients->
                               super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_218);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::push_back(this_00,&temp);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&temp);
          iVar4 = -1;
        }
        iVar4 = iVar4 + 1;
      }
      local_218 = local_218 + 1;
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
      lVar1 = *(long *)(*(long *)inFile + -0x18);
    }
    std::__cxx11::string::~string((string *)&items);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&temp);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void Hospital::Read_From_File_And_Create_Bill (vector<Patient>&All_Of_Patients  , fstream& inFile ){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    vector<string>temp;
    string items;
    int counter=0;
    int Patients_Index=0;

    while(!inFile.eof()) {

        getline(inFile, items);
        istringstream ss(items);
        string word;

        while (ss >> word)
        {
            temp.push_back(word);
            if(counter == 4){
                All_Of_Patients[Patients_Index].Bill_Info_getter().push_back(temp);
                temp.clear();
                counter = -1;
            }
            counter++;
        }
        Patients_Index++;
    }

}